

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O0

int evmap_reinit_(event_base *base)

{
  int local_1c;
  event_base *peStack_18;
  int result;
  event_base *base_local;
  
  local_1c = 0;
  peStack_18 = base;
  evmap_io_foreach_fd(base,evmap_io_reinit_iter_fn,&local_1c);
  if (local_1c < 0) {
    base_local._4_4_ = -1;
  }
  else {
    evmap_signal_foreach_signal(peStack_18,evmap_signal_reinit_iter_fn,&local_1c);
    if (local_1c < 0) {
      base_local._4_4_ = -1;
    }
    else {
      base_local._4_4_ = 0;
    }
  }
  return base_local._4_4_;
}

Assistant:

int
evmap_reinit_(struct event_base *base)
{
	int result = 0;

	evmap_io_foreach_fd(base, evmap_io_reinit_iter_fn, &result);
	if (result < 0)
		return -1;
	evmap_signal_foreach_signal(base, evmap_signal_reinit_iter_fn, &result);
	if (result < 0)
		return -1;
	return 0;
}